

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,Ea<(moira::Mode)9,_(moira::Size)4> *ea)

{
  StrWriter *pSVar1;
  StrWriter *this_00;
  int *in_RSI;
  StrWriter *in_RDI;
  UInt resolved;
  StrWriter local_50;
  UInt local_18;
  Int local_14;
  int *local_10;
  
  local_10 = in_RSI;
  pSVar1 = operator<<(in_RDI,"(");
  Int::Int(&local_14,(int)(short)local_10[2]);
  this_00 = operator<<(pSVar1,(Int)(i32)((ulong)in_RDI >> 0x20));
  operator<<(this_00,",PC)");
  UInt::UInt(&local_18,*local_10 + (int)(short)local_10[2] + 2);
  StrWriter(&local_50,in_RDI->comment,(bool)(in_RDI->hex & 1),(bool)(in_RDI->upper & 1));
  operator<<(&local_50,"; (");
  pSVar1 = operator<<(pSVar1,(UInt)(u32)((ulong)in_RDI >> 0x20));
  pSVar1 = operator<<(pSVar1,")");
  operator<<(pSVar1);
  return in_RDI;
}

Assistant:

StrWriter&
StrWriter::operator<<(const Ea<M,S> &ea)
{
    switch (M) {

        case 0: // Dn
        {
            *this << Dn{ea.reg};
            break;
        }
        case 1: // An
        {
            *this << An{ea.reg};
            break;
        }
        case 2: // (An)
        {
            *this << "(" << An{ea.reg} << ")";
            break;
        }
        case 3:  // (An)+
        {
            *this << "(" << An{ea.reg} << ")+";
            break;
        }
        case 4: // -(An)
        {
            *this << "-(" << An{ea.reg} << ")";
            break;
        }
        case 5: // (d,An)
        {
            *this << "(" << Int{(i16)ea.ext1};
            *this << "," << An{ea.reg} << ")";
            break;
        }
        case 6: // (d,An,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 7: // ABS.W
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".W" : ".w");
            break;
        }
        case 8: // ABS.L
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".L" : ".l");
            break;
        }
        case 9: // (d,PC)
        {
            *this << "(" << Int{(i16)ea.ext1} << ",PC)";
            auto resolved = UInt(ea.pc + (i16)ea.ext1 + 2);
            StrWriter(comment, hex, upper) << "; (" << resolved << ")" << Finish{};
            break;
        }
        case 10: // (d,PC,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 11: // Imm
        {
            *this << Imu(ea.ext1);
            break;
        }
    }
    return *this;
}